

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_short,_true>::push_back
          (SmallVectorTemplateBase<unsigned_short,_true> *this,unsigned_short *Elt)

{
  if (*(uint *)(this + 0xc) <= *(uint *)(this + 8)) {
    SmallVectorTemplateBase<unsigned_short,true>::push_back(this);
  }
  *(unsigned_short *)(*(long *)this + (ulong)*(uint *)(this + 8) * 2) = *Elt;
  if (*(uint *)(this + 8) < *(uint *)(this + 0xc)) {
    *(uint *)(this + 8) = *(uint *)(this + 8) + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }